

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::
     bitfield_extract_invalid_value_type(NegativeTestContext *ctx)

{
  ShaderType shaderType;
  bool bVar1;
  char *__s;
  long *plVar2;
  size_type *psVar3;
  long lVar4;
  string shaderSource;
  DataType in_stack_ffffffffffffff58;
  allocator<char> local_99;
  string local_98;
  long local_78;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"bitfieldExtract: Invalid value type.","");
  NegativeTestContext::beginSection(ctx,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  lVar4 = 0;
  do {
    shaderType = (&NegativeTestShared::(anonymous_namespace)::s_shaders)[lVar4];
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar1) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_70,__s,&local_99);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x1cbc003);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      psVar3 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_98.field_2._M_allocated_capacity = *psVar3;
        local_98.field_2._8_8_ = plVar2[3];
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar3;
        local_98._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_98._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      NegativeTestContext::beginSection(ctx,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      local_78 = lVar4;
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
      lVar4 = 0;
      do {
        NegativeTestShared::(anonymous_namespace)::genShaderSourceBitfieldExtract_abi_cxx11_
                  (&local_98,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType,
                   *(ShaderType *)
                    ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes + lVar4
                    ),TYPE_INT,TYPE_INT,in_stack_ffffffffffffff58);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,local_98._M_dataplus._M_p,
                   local_98._M_dataplus._M_p + local_98._M_string_length);
        verifyShader(ctx,shaderType,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0x10);
      NegativeTestContext::endSection(ctx);
      lVar4 = local_78;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void bitfield_extract_invalid_value_type (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_intTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));

	ctx.beginSection("bitfieldExtract: Invalid value type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_floatTypes); ++dataTypeNdx)
			{
				const std::string shaderSource(genShaderSourceBitfieldExtract(ctx, s_shaders[shaderNdx], s_floatTypes[dataTypeNdx], glu::TYPE_INT, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}